

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O0

void __thiscall deci::program_t::Evaluate(program_t *this,vm_t *vm,stack_t *stack,stack_t *local)

{
  double dVar1;
  value_t **ppvVar2;
  reference pvVar3;
  value_t *pvVar4;
  value_t *pvVar5;
  number_t *pnVar6;
  runtime_error *this_00;
  double topVal_1;
  double topVal;
  value_t *glob_value;
  value_t *loc_value;
  number_t *num_1;
  number_t *num;
  value_type command;
  size_t total;
  size_t pc;
  stack_t *local_local;
  stack_t *stack_local;
  vm_t *vm_local;
  program_t *this_local;
  
  command.arg = (value_t *)
                std::vector<deci::command_t,_std::allocator<deci::command_t>_>::size(&this->source);
  total = 0;
  do {
    if (command.arg <= total) {
      return;
    }
    pvVar3 = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::operator[]
                       (&this->source,total);
    num._0_4_ = pvVar3->opcode;
    num._4_4_ = *(undefined4 *)&pvVar3->field_0x4;
    ppvVar2 = &pvVar3->arg;
    command.opcode = *(opcode_t *)ppvVar2;
    command._4_4_ = *(undefined4 *)((long)&pvVar3->arg + 4);
    pvVar5 = *ppvVar2;
    switch((opcode_t)num) {
    case OP_FIRST:
      total = total + 1;
      break;
    case OP_ARG:
      dVar1 = number_t::Value((number_t *)*ppvVar2);
      pvVar5 = stack_t::Top(stack,(long)dVar1 |
                                  (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f);
      stack_t::Push(local,pvVar5);
      total = total + 1;
      break;
    case OP_PUSH:
      stack_t::Push(local,*ppvVar2);
      total = total + 1;
      break;
    case OP_RESULT:
      stack_t::Push(local,this->result);
      total = total + 1;
      break;
    case OP_DROP:
      dVar1 = number_t::Value((number_t *)*ppvVar2);
      stack_t::Drop(local,(int)dVar1);
      total = total + 1;
      break;
    case OP_CALL:
      (*this->result->_vptr_value_t[3])();
      pvVar5 = EvaluateCALL((command_t *)&num,vm,local);
      this->result = pvVar5;
      total = total + 1;
      break;
    case OP_RETURN:
      pvVar5 = stack_t::Top(local,0);
      stack_t::Result(local,pvVar5);
      total = total + 1;
      break;
    case OP_BIN:
      (*this->result->_vptr_value_t[3])();
      pvVar5 = EvaluateCALL((command_t *)&num,vm,local);
      this->result = pvVar5;
      stack_t::Drop(local,2);
      stack_t::Push(local,this->result);
      total = total + 1;
      break;
    case OP_RVAL:
      pvVar5 = stack_t::Variable(local,*ppvVar2);
      pvVar4 = nothing_t::Instance();
      if (pvVar5 == pvVar4) {
        pvVar5 = stack_t::Variable(stack,(value_t *)CONCAT44(command._4_4_,command.opcode));
        pvVar4 = nothing_t::Instance();
        if (pvVar5 == pvVar4) {
          pvVar5 = nothing_t::Instance();
          stack_t::Push(local,pvVar5);
          total = total + 1;
        }
        else {
          stack_t::Push(local,pvVar5);
          total = total + 1;
        }
      }
      else {
        stack_t::Push(local,pvVar5);
        total = total + 1;
      }
      break;
    case OP_SET:
      pvVar4 = stack_t::Top(local,0);
      stack_t::Variable(local,pvVar5,pvVar4);
      stack_t::Drop(local,1);
      total = total + 1;
      break;
    case OP_UNR:
      (*this->result->_vptr_value_t[3])();
      pvVar5 = EvaluateCALL((command_t *)&num,vm,local);
      this->result = pvVar5;
      stack_t::Drop(local,1);
      stack_t::Push(local,this->result);
      total = total + 1;
      break;
    case OP_JZ:
      pvVar5 = stack_t::Top(local,0);
      pnVar6 = (number_t *)__dynamic_cast(pvVar5,&value_t::typeinfo,&number_t::typeinfo,0);
      if (pnVar6 == (number_t *)0x0) {
        __cxa_bad_cast();
      }
      dVar1 = number_t::Value(pnVar6);
      stack_t::Drop(local,1);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        total = total + 1;
      }
      else {
        pnVar6 = (number_t *)
                 __dynamic_cast(CONCAT44(command._4_4_,command.opcode),&value_t::typeinfo,
                                &number_t::typeinfo,0);
        if (pnVar6 == (number_t *)0x0) {
          __cxa_bad_cast();
        }
        dVar1 = number_t::Value(pnVar6);
        total = (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
      }
      break;
    case OP_JMP:
      pnVar6 = (number_t *)__dynamic_cast(*ppvVar2,&value_t::typeinfo,&number_t::typeinfo,0);
      if (pnVar6 == (number_t *)0x0) {
        __cxa_bad_cast();
      }
      dVar1 = number_t::Value(pnVar6);
      total = (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
      break;
    default:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unknown Operation Code");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case OP_JNZ:
      pvVar5 = stack_t::Top(local,0);
      pnVar6 = (number_t *)__dynamic_cast(pvVar5,&value_t::typeinfo,&number_t::typeinfo,0);
      if (pnVar6 == (number_t *)0x0) {
        __cxa_bad_cast();
      }
      dVar1 = number_t::Value(pnVar6);
      stack_t::Drop(local,1);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pnVar6 = (number_t *)
                 __dynamic_cast(CONCAT44(command._4_4_,command.opcode),&value_t::typeinfo,
                                &number_t::typeinfo,0);
        if (pnVar6 == (number_t *)0x0) {
          __cxa_bad_cast();
        }
        dVar1 = number_t::Value(pnVar6);
        total = (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
      }
      else {
        total = total + 1;
      }
    }
  } while( true );
}

Assistant:

void program_t::Evaluate(vm_t& vm, const stack_t& stack, stack_t& local) {
    size_t pc;
    size_t total = this->source.size();

#define NEXT_PC() ++pc; break
#define JUMP_PC(NPC) pc = NPC; break

    for (pc = 0; pc < total;) {
      auto command = this->source[pc];

      switch (command.opcode) {
      case OP_NOP:
        NEXT_PC();
      case OP_ARG:
      {
        number_t& num = *static_cast<number_t*>(command.arg);
        local.Push(stack.Top(static_cast<size_t>(num.Value())));
        NEXT_PC();
      }
      case OP_PUSH:
        local.Push(*command.arg);
        NEXT_PC();
      case OP_DROP:
      {
        number_t& num = *static_cast<number_t*>(command.arg);
        local.Drop(static_cast<int>(num.Value()));
        NEXT_PC();
      }
      case OP_CALL:
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        NEXT_PC();
      case OP_RESULT:
        local.Push(*this->result);
        NEXT_PC();
      case OP_RETURN:
        local.Result(local.Top(0));
        NEXT_PC();
      case OP_BIN:
      {
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        local.Drop(2);
        local.Push(*this->result);
        NEXT_PC();
      }
      case OP_RVAL:
      {
        const value_t& loc_value = local.Variable(*command.arg);       
        if (&loc_value != &nothing_t::Instance()) {
          local.Push(loc_value);
          NEXT_PC();
        }
        const value_t& glob_value = stack.Variable(*command.arg);
        if (&glob_value != &nothing_t::Instance()) {
          local.Push(glob_value);
          NEXT_PC();
        }
        local.Push(nothing_t::Instance());
        NEXT_PC();
      }
      case OP_SET:
      {
        local.Variable(*command.arg, local.Top(0));
        local.Drop(1);
        NEXT_PC();
      }
      case OP_UNR:
      {
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        local.Drop(1);
        local.Push(*this->result);
        NEXT_PC();
      }
      case OP_JZ:
      {
        double topVal = dynamic_cast<number_t&>(local.Top(0)).Value();
        local.Drop(1);
        if (topVal == 0.0) {
          JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
        }
        NEXT_PC();
      }
      case OP_JMP:
      {
        JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
      }
      case OP_JNZ:
      {
        double topVal = dynamic_cast<number_t&>(local.Top(0)).Value();
        local.Drop(1);
        if (topVal != 0.0) {
          JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
        }
        NEXT_PC();
      }
      default:
        throw std::runtime_error("Unknown Operation Code");
      }
    }
  }